

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_write_integer(mg_session *session,int64_t value)

{
  long in_RSI;
  int status_3;
  int status_2;
  int status_1;
  int status;
  undefined2 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffde;
  uint8_t in_stack_ffffffffffffffdf;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  if ((in_RSI < -0x10) || (0x7f < in_RSI)) {
    if ((in_RSI < -0x80) || (0x7f < in_RSI)) {
      if ((in_RSI < -0x8000) || (0x7fff < in_RSI)) {
        if ((in_RSI < -0x80000000) || (0x7fffffff < in_RSI)) {
          local_4 = mg_session_write_uint8
                              ((mg_session *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdf);
          if (local_4 == 0) {
            local_4 = mg_session_write_uint64
                                ((mg_session *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                 (ulong)CONCAT13(in_stack_ffffffffffffffdf,
                                                 CONCAT12(in_stack_ffffffffffffffde,
                                                          in_stack_ffffffffffffffdc)) << 0x20);
          }
        }
        else {
          local_4 = mg_session_write_uint8
                              ((mg_session *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdf);
          if (local_4 == 0) {
            local_4 = mg_session_write_uint32
                                ((mg_session *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0);
          }
        }
      }
      else {
        local_4 = mg_session_write_uint8
                            ((mg_session *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdf);
        if (local_4 == 0) {
          local_4 = mg_session_write_uint16
                              ((mg_session *)((ulong)in_stack_ffffffffffffffe4 << 0x20),
                               CONCAT11(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde));
        }
      }
    }
    else {
      local_4 = mg_session_write_uint8
                          ((mg_session *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdf);
      if (local_4 == 0) {
        local_4 = mg_session_write_uint8
                            ((mg_session *)(ulong)in_stack_ffffffffffffffe0,
                             in_stack_ffffffffffffffdf);
      }
    }
  }
  else {
    local_4 = mg_session_write_uint8
                        ((mg_session *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                         ,in_stack_ffffffffffffffdf);
  }
  return local_4;
}

Assistant:

int mg_session_write_integer(mg_session *session, int64_t value) {
  if (value >= MG_TINY_INT_MIN && value <= MG_TINY_INT_MAX) {
    return mg_session_write_uint8(session, (uint8_t)value);
  }
  if (value >= INT8_MIN && value <= INT8_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_8));
    return mg_session_write_uint8(session, (uint8_t)value);
  }
  if (value >= INT16_MIN && value <= INT16_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_16));
    return mg_session_write_uint16(session, (uint16_t)value);
  }
  if (value >= INT32_MIN && value <= INT32_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_32));
    return mg_session_write_uint32(session, (uint32_t)value);
  }
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_64));
  return mg_session_write_uint64(session, (uint64_t)value);
}